

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::anon_unknown_59::InMemoryFile::Impl::ensureCapacity(Impl *this,size_t capacity)

{
  bool bVar1;
  size_t sVar2;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> size;
  uchar *puVar3;
  uchar *__src;
  size_t sVar4;
  Array<unsigned_char> *other;
  unsigned_long local_88;
  undefined1 local_80 [8];
  Array<unsigned_char> newBytes;
  Fault local_58;
  Fault f;
  uint *local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  size_t capacity_local;
  Impl *this_local;
  
  _kjCondition._32_8_ = capacity;
  sVar2 = Array<unsigned_char>::size(&this->bytes);
  if (sVar2 < (ulong)_kjCondition._32_8_) {
    local_48 = (uint *)_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->mmapCount);
    f.exception._4_4_ = 0;
    _::DebugExpression<unsigned_int&>::operator==
              ((DebugComparison<unsigned_int_&,_int> *)local_40,
               (DebugExpression<unsigned_int&> *)&local_48,(int *)((long)&f.exception + 4));
    bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
    if (!bVar1) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[79]>
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x394,FAILED,"mmapCount == 0",
                 "_kjCondition,\"InMemoryFile cannot resize the file backing store while memory mappings exist.\""
                 ,(DebugComparison<unsigned_int_&,_int> *)local_40,
                 (char (*) [79])
                 "InMemoryFile cannot resize the file backing store while memory mappings exist.");
      _::Debug::Fault::fatal(&local_58);
    }
    sVar2 = Array<unsigned_char>::size(&this->bytes);
    local_88 = sVar2 << 1;
    size = max<unsigned_long&,unsigned_long>((unsigned_long *)&_kjCondition.result,&local_88);
    heapArray<unsigned_char>((Array<unsigned_char> *)local_80,size);
    if (this->size != 0) {
      puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_80);
      __src = Array<unsigned_char>::begin(&this->bytes);
      memcpy(puVar3,__src,this->size);
    }
    puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_80);
    sVar2 = this->size;
    sVar4 = Array<unsigned_char>::size((Array<unsigned_char> *)local_80);
    memset(puVar3 + sVar2,0,sVar4 - this->size);
    other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_80);
    Array<unsigned_char>::operator=(&this->bytes,other);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_80);
  }
  return;
}

Assistant:

void ensureCapacity(size_t capacity) {
      if (bytes.size() < capacity) {
        KJ_ASSERT(mmapCount == 0,
            "InMemoryFile cannot resize the file backing store while memory mappings exist.");

        auto newBytes = heapArray<byte>(kj::max(capacity, bytes.size() * 2));
        if (size > 0) {  // placate ubsan; bytes.begin() might be null
          memcpy(newBytes.begin(), bytes.begin(), size);
        }
        memset(newBytes.begin() + size, 0, newBytes.size() - size);
        bytes = kj::mv(newBytes);
      }
    }